

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O0

ValidPointers<SmallAllocationBlockAttributes> __thiscall
Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GetValidPointersForIndex
          (ValidPointersMap<SmallAllocationBlockAttributes> *this,uint bucketIndex)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  ushort *validPointers;
  uint bucketIndex_local;
  ValidPointersMap<SmallAllocationBlockAttributes> *this_local;
  
  if (0x2f < bucketIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                       ,0x17c,"(bucketIndex < TBlockAttributes::BucketCount)",
                       "bucketIndex < TBlockAttributes::BucketCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  ValidPointers<SmallAllocationBlockAttributes>::ValidPointers
            ((ValidPointers<SmallAllocationBlockAttributes> *)&this_local,
             this->validPointersBuffer[bucketIndex],bucketIndex);
  return _this_local;
}

Assistant:

inline const ValidPointers<TBlockAttributes> GetValidPointersForIndex(uint bucketIndex) const
        {
            AnalysisAssert(bucketIndex < TBlockAttributes::BucketCount);
            ushort const * validPointers = nullptr;
#if USE_VPM_TABLE
            validPointers = validPointersBuffer[bucketIndex];
#endif
            return ValidPointers<TBlockAttributes>(validPointers, bucketIndex);
        }